

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O2

void fiat_p256_opp(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar3 = (ulong)(*arg1 != 0) + arg1[1];
  uVar4 = -lVar3;
  uVar5 = (ulong)(byte)-(-(lVar3 != 0) - CARRY8((ulong)(*arg1 != 0),arg1[1]));
  lVar3 = uVar5 + arg1[2];
  uVar6 = -lVar3;
  uVar5 = (ulong)(byte)-(-(lVar3 != 0) - CARRY8(uVar5,arg1[2]));
  lVar3 = uVar5 + arg1[3];
  uVar2 = -(ulong)((bool)-(lVar3 != 0) != CARRY8(uVar5,arg1[3]));
  uVar5 = (ulong)CARRY8(-*arg1,uVar2);
  uVar1 = (uVar2 & 0xffffffff) + uVar4;
  uVar4 = (ulong)(CARRY8(uVar2 & 0xffffffff,uVar4) || CARRY8(uVar1,uVar5));
  *out1 = -*arg1 + uVar2;
  out1[1] = uVar1 + uVar5;
  out1[2] = uVar6 + uVar4;
  out1[3] = ((uVar2 & 0xffffffff00000001) - lVar3) + (ulong)CARRY8(uVar6,uVar4);
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_subborrowx_u64(uint64_t* out1, fiat_p256_uint1* out2, fiat_p256_uint1 arg1, uint64_t arg2, uint64_t arg3) {
  fiat_p256_int128 x1;
  fiat_p256_int1 x2;
  uint64_t x3;
  x1 = ((arg2 - (fiat_p256_int128)arg1) - arg3);
  x2 = (fiat_p256_int1)(x1 >> 64);
  x3 = (uint64_t)(x1 & UINT64_C(0xffffffffffffffff));
  *out1 = x3;
  *out2 = (fiat_p256_uint1)(0x0 - x2);
}